

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  ConstantPaddingLayerParams *this_00;
  string *psVar3;
  uint64 uVar4;
  uint64 uVar5;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string err_2;
  int pad_b;
  int pad_a;
  int i;
  undefined1 local_138 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string err;
  int len;
  ConstantPaddingLayerParams *params;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar1;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    layer_00 = local_20;
    if (local_38 == 0) {
      local_3a = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"ConstantPad",(allocator<char> *)((long)&params + 7));
      validateInputOutputRankEquality
                (__return_storage_ptr__,layer_00,&local_60,&this->blobNameToRank);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        local_3a = 1;
      }
      local_38 = (uint)!bVar1;
      if ((local_3a & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        this_00 = Specification::NeuralNetworkLayer::constantpad(local_20);
        iVar2 = Specification::NeuralNetworkLayer::input_size(local_20);
        if (iVar2 == 1) {
          err.field_2._12_4_ = Specification::ConstantPaddingLayerParams::padamounts_size(this_00);
          if ((int)err.field_2._12_4_ % 2 != 0) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::operator+(&local_f8,"In \'ConstantPad\' layer \'",psVar3);
            std::operator+(&local_d8,&local_f8,"\', length of \'padAmounts\' parameter is ");
            std::__cxx11::to_string((string *)((long)&err_1.field_2 + 8),err.field_2._12_4_);
            std::operator+(&local_b8,&local_d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&err_1.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,&local_b8,", an odd value, which is not allowed.");
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_98);
            return __return_storage_ptr__;
          }
          if (err.field_2._12_4_ == 0) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pad_a,"In \'ConstantPad\' layer \'",psVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pad_a,
                           "\', length of \'padAmounts\' cannot be zero when only 1 input is provided."
                          );
            std::__cxx11::string::~string((string *)&pad_a);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_138);
            return __return_storage_ptr__;
          }
          bVar1 = Specification::ConstantPaddingLayerParams::padtogivenoutputsizemode(this_00);
          if (bVar1) {
            for (pad_b = 0; pad_b < (int)err.field_2._12_4_ / 2; pad_b = pad_b + 1) {
              uVar4 = Specification::ConstantPaddingLayerParams::padamounts(this_00,pad_b << 1);
              uVar5 = Specification::ConstantPaddingLayerParams::padamounts(this_00,pad_b * 2 + 1);
              err_2.field_2._12_4_ = (undefined4)uVar5;
              if ((0 < (int)uVar4) && (0 < (int)err_2.field_2._12_4_)) {
                psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                std::operator+(&local_1e8,"In \'ConstantPad\' layer \'",psVar3);
                std::operator+(&local_1c8,&local_1e8,
                               "\', \'padToGivenOutputSizeMode\' is true, and both padding values corresponding to dimension "
                              );
                std::__cxx11::to_string(&local_208,pad_b);
                std::operator+(&local_1a8,&local_1c8,&local_208);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_188,&local_1a8,
                               " are non zero, which is invalid. Only one value can be non-zero.");
                std::__cxx11::string::~string((string *)&local_1a8);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1e8);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_188);
                local_38 = 1;
                std::__cxx11::string::~string((string *)local_188);
                return __return_storage_ptr__;
              }
            }
          }
        }
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank));

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}